

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

TSNode * ts_node__child(TSNode *__return_storage_ptr__,TSNode self,uint32_t child_index,
                       _Bool include_anonymous)

{
  SubtreeHeapData *pSVar1;
  TSTree *_self;
  _Bool _Var2;
  Subtree *pSVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  TSNode *extraout_RAX;
  Subtree tree;
  uint uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Subtree local_60;
  TSTree *local_58;
  uint32_t local_50;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  TSSymbol *local_38;
  TSNode *pTVar4;
  
  _self = self.tree;
  pSVar3 = (Subtree *)self.id;
  uVar7 = self.context._4_8_;
  local_58 = self.tree;
  local_50 = self.context[0];
LAB_0012a45f:
  local_60 = (Subtree)pSVar3->ptr;
  if ((((ulong)local_60.ptr & 1) == 0) && ((local_60.ptr)->child_count != 0)) {
    uVar8 = (ulong)((local_60.ptr)->field_17).field_0.alias_sequence_id;
    if (uVar8 == 0) {
      local_38 = (TSSymbol *)0x0;
    }
    else {
      local_38 = local_58->language->alias_sequences +
                 local_58->language->max_alias_sequence_length * uVar8;
    }
    uStack_4c = (uint32_t)uVar7;
    uStack_48 = SUB84(uVar7,4);
  }
  else {
    local_60.ptr = (SubtreeHeapData *)0x0;
    local_38 = (TSSymbol *)0x0;
    local_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
  }
  uStack_40 = 0;
  uStack_44 = 0;
  _Var2 = ts_node_child_iterator_next((NodeChildIterator *)&local_60.data,__return_storage_ptr__);
  pTVar4 = (TSNode *)CONCAT71(extraout_var,_Var2);
  if (!_Var2) {
LAB_0012a5ba:
    __return_storage_ptr__->id = (void *)0x0;
    __return_storage_ptr__->tree = (TSTree *)0x0;
    __return_storage_ptr__->context[0] = 0;
    __return_storage_ptr__->context[1] = 0;
    __return_storage_ptr__->context[2] = 0;
    __return_storage_ptr__->context[3] = 0;
    return pTVar4;
  }
  uVar6 = 0;
  do {
    pSVar3 = (Subtree *)__return_storage_ptr__->id;
    pSVar1 = pSVar3->ptr;
    if (include_anonymous) {
      if (((ulong)pSVar1 & 1) == 0) {
        uVar5 = (uint)*(ushort *)&pSVar1->field_0x2c;
      }
      else {
        uVar5 = (uint)((ulong)pSVar1 >> 1) & 0x7fffffff;
      }
      if (((uVar5 & 1) == 0) && (__return_storage_ptr__->context[3] == 0)) goto LAB_0012a560;
LAB_0012a583:
      if (child_index == uVar6) {
        ts_tree_set_cached_parent(_self,__return_storage_ptr__,&self);
        return extraout_RAX;
      }
      uVar6 = uVar6 + 1;
    }
    else {
      if (((ulong)pSVar1 & 1) == 0) {
        if ((*(ushort *)&pSVar1->field_0x2c & 1) != 0) {
          uVar5 = (uint)(*(ushort *)&pSVar1->field_0x2c >> 1);
          goto LAB_0012a52b;
        }
      }
      else if (((ulong)pSVar1 & 2) != 0) {
        uVar5 = (uint)((ulong)pSVar1 >> 2) & 0x3fffffff;
LAB_0012a52b:
        if ((uVar5 & 1) != 0) goto LAB_0012a583;
      }
      uVar5 = __return_storage_ptr__->context[3];
      if (((uVar5 != 0) && ((ushort)uVar5 != 0xfffe)) &&
         (((uVar5 & 0xffff) == 0xffff ||
          (((byte)__return_storage_ptr__->tree->language->symbol_metadata[(ushort)uVar5] & 2) != 0))
         )) goto LAB_0012a583;
LAB_0012a560:
      uVar5 = 0;
      if ((((ulong)pSVar1 & 1) == 0) && (uVar5 = 0, pSVar1->child_count != 0)) {
        uVar5 = *(uint *)((long)&pSVar1->field_17 + (ulong)!include_anonymous * 4 + 8);
        if (child_index - uVar6 < uVar5) break;
      }
      uVar6 = uVar5 + uVar6;
    }
    _Var2 = ts_node_child_iterator_next((NodeChildIterator *)&local_60.data,__return_storage_ptr__);
    pTVar4 = (TSNode *)CONCAT71(extraout_var_00,_Var2);
    if (!_Var2) goto LAB_0012a5ba;
  } while( true );
  local_50 = __return_storage_ptr__->context[0];
  uVar7 = *(undefined8 *)(__return_storage_ptr__->context + 1);
  local_58 = __return_storage_ptr__->tree;
  child_index = child_index - uVar6;
  goto LAB_0012a45f;
}

Assistant:

static inline TSNode ts_node__child(TSNode self, uint32_t child_index, bool include_anonymous) {
  TSNode result = self;
  bool did_descend = true;

  while (did_descend) {
    did_descend = false;

    TSNode child;
    uint32_t index = 0;
    NodeChildIterator iterator = ts_node_iterate_children(&result);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (ts_node__is_relevant(child, include_anonymous)) {
        if (index == child_index) {
          ts_tree_set_cached_parent(self.tree, &child, &self);
          return child;
        }
        index++;
      } else {
        uint32_t grandchild_index = child_index - index;
        uint32_t grandchild_count = ts_node__relevant_child_count(child, include_anonymous);
        if (grandchild_index < grandchild_count) {
          did_descend = true;
          result = child;
          child_index = grandchild_index;
          break;
        }
        index += grandchild_count;
      }
    }
  }

  return ts_node__null();
}